

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

uint flatbuffers::HashFnv1<unsigned_int>(char *input)

{
  uint uVar1;
  byte bVar2;
  char *c;
  byte *pbVar3;
  
  bVar2 = *input;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(input + 1);
    uVar1 = 0x811c9dc5;
    do {
      uVar1 = (uint)bVar2 ^ uVar1 * 0x1000193;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
    return uVar1;
  }
  return 0x811c9dc5;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}